

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::HasMacOSXRpathInstallNameDir(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ImportInfo *pIVar4;
  long lVar5;
  size_t sVar6;
  cmake *this_01;
  char *pcVar7;
  bool bVar8;
  string install_name;
  undefined1 local_1f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  if (this->Target->IsImportedTarget == false) {
    if (this->Target->TargetTypeValue != SHARED_LIBRARY) {
      return false;
    }
    local_1a0._0_8_ = local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"INSTALL_NAME_DIR","");
    pcVar7 = GetProperty(this,(string *)local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._0_8_ != local_190) {
      operator_delete((void *)local_1a0._0_8_,
                      CONCAT71(local_190[0]._M_allocated_capacity._1_7_,local_190[0]._M_local_buf[0]
                              ) + 1);
    }
    bVar2 = MacOSXUseInstallNameDir(this);
    if (pcVar7 == (char *)0x0 || !bVar2) {
      bVar8 = false;
    }
    else {
      local_1c0._M_allocated_capacity = (size_type)local_1b0;
      sVar6 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,pcVar7,pcVar7 + sVar6);
      iVar3 = std::__cxx11::string::compare(local_1c0._M_local_buf);
      bVar8 = iVar3 == 0;
      if ((long *)local_1c0._M_allocated_capacity != local_1b0) {
        operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0[0] + 1);
      }
    }
    bVar2 = (bool)(!bVar2 | bVar8 | pcVar7 == (char *)0x0);
    if (bVar2 && !bVar8) {
      bVar1 = MacOSXRpathInstallNameDirDefault(this);
    }
    else {
      bVar1 = false;
    }
    if (!bVar2) {
      return false;
    }
  }
  else {
    pIVar4 = GetImportInfo(this,config);
    if (pIVar4 == (ImportInfo *)0x0) {
      bVar1 = false;
      bVar8 = false;
    }
    else if ((pIVar4->NoSOName == false) && ((pIVar4->SOName)._M_string_length != 0)) {
      bVar1 = false;
      lVar5 = std::__cxx11::string::find((char *)&pIVar4->SOName,0x4d7337,0);
      bVar8 = lVar5 == 0;
    }
    else {
      local_1a0._8_8_ = (_Base_ptr)0x0;
      local_190[0]._M_local_buf[0] = '\0';
      local_1a0._0_8_ = local_190;
      cmSystemTools::GuessLibraryInstallName(&pIVar4->Location,(string *)local_1a0);
      lVar5 = std::__cxx11::string::find(local_1a0,0x4d1793,0);
      bVar8 = lVar5 != -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._0_8_ != local_190) {
        operator_delete((void *)local_1a0._0_8_,
                        CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                 local_190[0]._M_local_buf[0]) + 1);
      }
      bVar1 = false;
    }
  }
  if ((!bVar8) && (bVar1 == false)) {
    return false;
  }
  this_00 = this->Makefile;
  local_1a0._0_8_ = local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG","");
  bVar2 = cmMakefile::IsSet(this_00,(string *)local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._0_8_ != local_190) {
    operator_delete((void *)local_1a0._0_8_,
                    CONCAT71(local_190[0]._M_allocated_capacity._1_7_,local_190[0]._M_local_buf[0])
                    + 1);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Attempting to use ",0x12);
    pcVar7 = "@rpath";
    if (bVar1 != false) {
      pcVar7 = "MACOSX_RPATH";
    }
    lVar5 = 6;
    if (bVar1 != false) {
      lVar5 = 0xc;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar7,lVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.",0x37);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"  This could be because you are using a Mac OS X version",0x38)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," less than 10.5 or because CMake\'s platform configuration is",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," corrupt.",9);
    this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    std::__cxx11::stringbuf::str();
    GetBacktrace((cmGeneratorTarget *)local_1f0);
    cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_1f0 + 0x10),
                        (cmListFileBacktrace *)local_1f0);
    if ((cmMakefile *)local_1f0._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._16_8_ != &local_1d0) {
      operator_delete((void *)local_1f0._16_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    return true;
  }
  return true;
}

Assistant:

bool cmGeneratorTarget::HasMacOSXRpathInstallNameDir(
  const std::string& config) const
{
  bool install_name_is_rpath = false;
  bool macosx_rpath = false;

  if (!this->IsImported()) {
    if (this->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return false;
    }
    const char* install_name = this->GetProperty("INSTALL_NAME_DIR");
    bool use_install_name = this->MacOSXUseInstallNameDir();
    if (install_name && use_install_name &&
        std::string(install_name) == "@rpath") {
      install_name_is_rpath = true;
    } else if (install_name && use_install_name) {
      return false;
    }
    if (!install_name_is_rpath) {
      macosx_rpath = this->MacOSXRpathInstallNameDirDefault();
    }
  } else {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (!info->NoSOName && !info->SOName.empty()) {
        if (info->SOName.find("@rpath/") == 0) {
          install_name_is_rpath = true;
        }
      } else {
        std::string install_name;
        cmSystemTools::GuessLibraryInstallName(info->Location, install_name);
        if (install_name.find("@rpath") != std::string::npos) {
          install_name_is_rpath = true;
        }
      }
    }
  }

  if (!install_name_is_rpath && !macosx_rpath) {
    return false;
  }

  if (!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG")) {
    std::ostringstream w;
    w << "Attempting to use ";
    if (macosx_rpath) {
      w << "MACOSX_RPATH";
    } else {
      w << "@rpath";
    }
    w << " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.";
    w << "  This could be because you are using a Mac OS X version";
    w << " less than 10.5 or because CMake's platform configuration is";
    w << " corrupt.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return true;
}